

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

CURLcode curlx_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  long lVar1;
  uint uVar2;
  size_t sVar3;
  uchar *__ptr;
  long lVar4;
  long lVar5;
  uchar *puVar6;
  size_t padc;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  uchar lookup [256];
  byte local_138 [43];
  undefined1 local_10d [221];
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar3 = strlen(src);
  if ((sVar3 & 3) == 0 && sVar3 != 0) {
    lVar11 = 0;
    do {
      if (src[lVar11 + (sVar3 - 1)] != '=') {
        lVar1 = (sVar3 >> 2) * 3;
        lVar9 = ((sVar3 >> 2) - 1) + (ulong)(lVar11 == 0);
        __ptr = (uchar *)malloc(lVar11 + lVar1 + 1);
        if (__ptr == (uchar *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        memset(local_138,0xff,0x100);
        memcpy(local_10d,decodetable,0x50);
        puVar6 = __ptr;
        if (lVar9 != 0) {
          lVar4 = 0;
          pcVar10 = src;
          do {
            src = pcVar10 + 4;
            lVar5 = 0;
            uVar8 = 0;
            do {
              if (local_138[(byte)pcVar10[lVar5]] == 0xff) goto LAB_0012046d;
              uVar2 = uVar8 << 6;
              uVar8 = local_138[(byte)pcVar10[lVar5]] | uVar2;
              lVar5 = lVar5 + 1;
            } while ((int)lVar5 != 4);
            puVar6[2] = (uchar)uVar8;
            puVar6[1] = (uchar)(uVar2 >> 8);
            *puVar6 = (uchar)(uVar2 >> 0x10);
            puVar6 = puVar6 + 3;
            lVar4 = lVar4 + 1;
            pcVar10 = src;
          } while (lVar4 != lVar9);
        }
        if (lVar11 != 0) {
          lVar9 = 0;
          uVar7 = 0;
          uVar8 = 0;
          do {
            if ((ulong)(byte)src[lVar9] == 0x3d) {
              uVar7 = uVar7 + 1;
              if ((ulong)-lVar11 < uVar7) {
LAB_0012046d:
                free(__ptr);
                return CURLE_BAD_CONTENT_ENCODING;
              }
              uVar8 = uVar8 << 6;
            }
            else {
              if (local_138[(byte)src[lVar9]] == 0xff) goto LAB_0012046d;
              uVar8 = uVar8 << 6 | (uint)local_138[(byte)src[lVar9]];
            }
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 != 4);
          if (lVar11 == -1) {
            puVar6[1] = (uchar)(uVar8 >> 8);
          }
          *puVar6 = (uchar)(uVar8 >> 0x10);
          puVar6 = puVar6 + lVar11 + 3;
        }
        *puVar6 = '\0';
        *outptr = __ptr;
        *outlen = lVar1 + lVar11;
        return CURLE_OK;
      }
      lVar11 = lVar11 + -1;
    } while (lVar11 != -3);
  }
  return CURLE_BAD_CONTENT_ENCODING;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t fullQuantums;
  size_t rawlen = 0;
  unsigned char *pos;
  unsigned char *newstr;
  unsigned char lookup[256];

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* srclen is at least 4 here */
  while(src[srclen - 1 - padding] == '=') {
    /* count padding characters */
    padding++;
    /* A maximum of two = padding characters is allowed */
    if(padding > 2)
      return CURLE_BAD_CONTENT_ENCODING;
  }

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;
  fullQuantums = numQuantums - (padding ? 1 : 0);

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a null-terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  memset(lookup, 0xff, sizeof(lookup));
  memcpy(&lookup['+'], decodetable, sizeof(decodetable));
  /* replaces
  {
    unsigned char c;
    const unsigned char *p = (const unsigned char *)base64encdec;
    for(c = 0; *p; c++, p++)
      lookup[*p] = c;
  }
  */

  /* Decode the complete quantums first */
  for(i = 0; i < fullQuantums; i++) {
    unsigned char val;
    unsigned int x = 0;
    int j;

    for(j = 0; j < 4; j++) {
      val = lookup[(unsigned char)*src++];
      if(val == 0xff) /* bad symbol */
        goto bad;
      x = (x << 6) | val;
    }
    pos[2] = x & 0xff;
    pos[1] = (x >> 8) & 0xff;
    pos[0] = (x >> 16) & 0xff;
    pos += 3;
  }
  if(padding) {
    /* this means either 8 or 16 bits output */
    unsigned char val;
    unsigned int x = 0;
    int j;
    size_t padc = 0;
    for(j = 0; j < 4; j++) {
      if(*src == '=') {
        x <<= 6;
        src++;
        if(++padc > padding)
          /* this is a badly placed '=' symbol! */
          goto bad;
      }
      else {
        val = lookup[(unsigned char)*src++];
        if(val == 0xff) /* bad symbol */
          goto bad;
        x = (x << 6) | val;
      }
    }
    if(padding == 1)
      pos[1] = (x >> 8) & 0xff;
    pos[0] = (x >> 16) & 0xff;
    pos += 3 - padding;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
bad:
  free(newstr);
  return CURLE_BAD_CONTENT_ENCODING;
}